

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

ModportClockingPortSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ModportClockingPortSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::parsing::Token&,slang::parsing::Token&>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          Token *args_1,Token *args_2)

{
  Info *pIVar1;
  Info *pIVar2;
  size_type sVar3;
  pointer ppAVar4;
  SyntaxKind SVar5;
  undefined4 uVar6;
  TokenKind TVar7;
  undefined1 uVar8;
  NumericTokenFlags NVar9;
  uint32_t uVar10;
  TokenKind TVar11;
  undefined1 uVar12;
  NumericTokenFlags NVar13;
  uint32_t uVar14;
  ModportClockingPortSyntax *pMVar15;
  long lVar16;
  
  pMVar15 = (ModportClockingPortSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ModportClockingPortSyntax *)this->endPtr < pMVar15 + 1) {
    pMVar15 = (ModportClockingPortSyntax *)allocateSlow(this,0x60,8);
  }
  else {
    this->head->current = (byte *)(pMVar15 + 1);
  }
  TVar7 = args_1->kind;
  uVar8 = args_1->field_0x2;
  NVar9.raw = (args_1->numFlags).raw;
  uVar10 = args_1->rawLen;
  pIVar1 = args_1->info;
  TVar11 = args_2->kind;
  uVar12 = args_2->field_0x2;
  NVar13.raw = (args_2->numFlags).raw;
  uVar14 = args_2->rawLen;
  pIVar2 = args_2->info;
  (pMVar15->super_MemberSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pMVar15->super_MemberSyntax).super_SyntaxNode.kind = ModportClockingPort;
  SVar5 = (args->super_SyntaxListBase).super_SyntaxNode.kind;
  uVar6 = *(undefined4 *)&(args->super_SyntaxListBase).super_SyntaxNode.field_0xc;
  (pMVar15->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent =
       (args->super_SyntaxListBase).super_SyntaxNode.parent;
  (pMVar15->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind = SVar5;
  *(undefined4 *)
   &(pMVar15->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0xc = uVar6
  ;
  (pMVar15->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_004e9f08;
  (pMVar15->super_MemberSyntax).attributes.super_SyntaxListBase.childCount =
       (args->super_SyntaxListBase).childCount;
  sVar3 = (args->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>).size_
  ;
  (pMVar15->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.data_ =
       (args->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>).data_;
  (pMVar15->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.size_ = sVar3;
  (pMVar15->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_004ea348;
  (pMVar15->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent =
       (SyntaxNode *)pMVar15;
  sVar3 = (pMVar15->super_MemberSyntax).attributes.
          super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.size_;
  if (sVar3 != 0) {
    ppAVar4 = (pMVar15->super_MemberSyntax).attributes.
              super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.data_;
    lVar16 = 0;
    do {
      **(undefined8 **)((long)ppAVar4 + lVar16) = pMVar15;
      lVar16 = lVar16 + 8;
    } while (sVar3 << 3 != lVar16);
  }
  (pMVar15->clocking).kind = TVar7;
  (pMVar15->clocking).field_0x2 = uVar8;
  (pMVar15->clocking).numFlags = (NumericTokenFlags)NVar9.raw;
  (pMVar15->clocking).rawLen = uVar10;
  (pMVar15->clocking).info = pIVar1;
  (pMVar15->name).kind = TVar11;
  (pMVar15->name).field_0x2 = uVar12;
  (pMVar15->name).numFlags = (NumericTokenFlags)NVar13.raw;
  (pMVar15->name).rawLen = uVar14;
  (pMVar15->name).info = pIVar2;
  return pMVar15;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }